

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

int streqci(char *s1,char *s2)

{
  char cVar1;
  char cVar2;
  long lVar3;
  char cVar4;
  
  lVar3 = 0;
  do {
    cVar1 = s1[lVar3];
    cVar4 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar4 = cVar1;
    }
    cVar1 = s2[lVar3];
    cVar2 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar2 = cVar1;
    }
    cVar1 = (cVar4 == '\0') * '\x02';
    if (cVar4 != cVar2) {
      cVar1 = '\x01';
    }
    lVar3 = lVar3 + 1;
  } while (cVar1 == '\0');
  if (cVar1 == '\x02') {
    return 1;
  }
  return 0;
}

Assistant:

static int FASTCALL
streqci(const char *s1, const char *s2)
{
  for (;;) {
    char c1 = *s1++;
    char c2 = *s2++;
    if (ASCII_a <= c1 && c1 <= ASCII_z)
      c1 += ASCII_A - ASCII_a;
    if (ASCII_a <= c2 && c2 <= ASCII_z)
      c2 += ASCII_A - ASCII_a;
    if (c1 != c2)
      return 0;
    if (!c1)
      break;
  }
  return 1;
}